

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O0

void __thiscall SuiteMessageTests::TestrejectSetString::RunImpl(TestrejectSetString *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  RefSeqNum *actual;
  TestDetails **ppTVar3;
  Text *actual_00;
  TestDetails local_2c8 [2];
  TestDetails local_288;
  int local_264;
  undefined1 local_260 [8];
  Text text;
  RefSeqNum refSeqNum;
  allocator<char> local_189;
  string local_188;
  undefined1 local_168 [8];
  Reject object;
  TestrejectSetString *this_local;
  
  object.super_Message._336_8_ = this;
  FIX42::Reject::Reject((Reject *)local_168);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,
             "8=FIX.4.2\x019=36\x0135=3\x0145=73\x0158=This Message SUCKS!!!\x0110=029\x01",
             &local_189);
  FIX::Message::setString((Message *)local_168,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  FIX::RefSeqNum::RefSeqNum
            ((RefSeqNum *)&text.super_StringField.super_FieldBase.m_metrics.m_checksum);
  FIX::Text::Text((Text *)local_260);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_264 = 0x49;
  actual = FIX42::Reject::get((Reject *)local_168,
                              (RefSeqNum *)
                              &text.super_StringField.super_FieldBase.m_metrics.m_checksum);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_288,*ppTVar3,0x2d9);
  UnitTest::CheckEqual<int,FIX::RefSeqNum>(pTVar1,&local_264,actual,&local_288);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  actual_00 = FIX42::Reject::get((Reject *)local_168,(Text *)local_260);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(local_2c8,*ppTVar3,0x2da);
  UnitTest::CheckEqual<char[22],FIX::Text>
            (pTVar1,(char (*) [22])"This Message SUCKS!!!",actual_00,local_2c8);
  FIX::Text::~Text((Text *)local_260);
  FIX::RefSeqNum::~RefSeqNum
            ((RefSeqNum *)&text.super_StringField.super_FieldBase.m_metrics.m_checksum);
  FIX42::Reject::~Reject((Reject *)local_168);
  return;
}

Assistant:

TEST(rejectSetString)
{
  Reject object;

  object.setString
    ( "8=FIX.4.2\0019=36\00135=3\00145=73\001"
      "58=This Message SUCKS!!!\00110=029\001" );

  RefSeqNum refSeqNum;
  Text text;
  CHECK_EQUAL( 73, object.get( refSeqNum ) );
  CHECK_EQUAL( "This Message SUCKS!!!", object.get( text ) );
}